

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O1

void rfc5444_writer_unregister_addrtlvtype(rfc5444_writer *writer,rfc5444_writer_tlvtype *tlvtype)

{
  list_entity *plVar1;
  list_entity *plVar2;
  rfc5444_writer_message *node;
  
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                  ,0x137,
                  "void rfc5444_writer_unregister_addrtlvtype(struct rfc5444_writer *, struct rfc5444_writer_tlvtype *)"
                 );
  }
  plVar1 = (tlvtype->_tlvtype_node).next;
  if ((plVar1 != (list_entity *)0x0) && ((tlvtype->_tlvtype_node).prev != (list_entity *)0x0)) {
    plVar2 = (tlvtype->_tlvtype_node).prev;
    plVar2->next = plVar1;
    plVar1->prev = plVar2;
    (tlvtype->_tlvtype_node).next = (list_entity *)0x0;
    (tlvtype->_tlvtype_node).prev = (list_entity *)0x0;
    node = tlvtype->_creator;
    if (node != (rfc5444_writer_message *)0x0) {
      if ((((node->_registered == false) && ((node->_addr_head).next == &node->_addr_head)) &&
          ((node->_addr_head).prev == &node->_addr_head)) &&
         ((((node->_msgspecific_tlvtype_head).next == &node->_msgspecific_tlvtype_head &&
           ((node->_msgspecific_tlvtype_head).prev == &node->_msgspecific_tlvtype_head)) &&
          ((node->_provider_tree).count == 0)))) {
        avl_remove(&writer->_msgcreators,&node->_msgcreator_node);
        free(node);
        return;
      }
      return;
    }
  }
  return;
}

Assistant:

void
rfc5444_writer_unregister_addrtlvtype(struct rfc5444_writer *writer, struct rfc5444_writer_tlvtype *tlvtype) {
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif
  if (!list_is_node_added(&tlvtype->_tlvtype_node)) {
    return;
  }

  list_remove(&tlvtype->_tlvtype_node);

  if (tlvtype->_creator) {
    /* message specific address tlv, see if we need to remove the message itself */
    _lazy_free_message(writer, tlvtype->_creator);
  }
}